

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O1

bool __thiscall
draco::PlyReader::ParseElementDataAscii(PlyReader *this,DecoderBuffer *buffer,int element_index)

{
  PlyProperty *property;
  pointer pPVar1;
  iterator iVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int32_t num_entries;
  float val;
  PlyPropertyWriter<double> prop_writer;
  int32_t local_74;
  double local_70;
  float local_64;
  PlyPropertyWriter<double> local_60;
  ulong local_38;
  
  pPVar1 = (this->elements_).
           super__Vector_base<draco::PlyElement,_std::allocator<draco::PlyElement>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar9 = (int)pPVar1[element_index].num_entries_;
  bVar4 = iVar9 < 1;
  if (0 < iVar9) {
    local_38 = 0;
    do {
      lVar7 = *(long *)&pPVar1[element_index].properties_.
                        super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>.
                        _M_impl;
      if (0 < (int)((ulong)((long)*(pointer *)
                                   ((long)&pPVar1[element_index].properties_.
                                           super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                                   + 8) - lVar7) >> 5) * -0x55555555) {
        lVar8 = 0;
        do {
          property = (PlyProperty *)(lVar7 + lVar8 * 0x60);
          PlyPropertyWriter<double>::PlyPropertyWriter(&local_60,property);
          local_74 = 1;
          if (*(int *)(lVar7 + 0x58 + lVar8 * 0x60) != 0) {
            parser::SkipWhitespace(buffer);
            bVar3 = parser::ParseSignedInt(buffer,&local_74);
            if (!bVar3) {
              if (local_60.convert_value_func_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                return bVar4;
              }
              (*local_60.convert_value_func_.super__Function_base._M_manager)
                        ((_Any_data *)&local_60.convert_value_func_,
                         (_Any_data *)&local_60.convert_value_func_,__destroy_functor);
              return bVar4;
            }
            local_70 = (double)((ulong)((long)(property->data_).
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(property->data_).
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start) /
                               (ulong)(long)property->data_type_num_bytes_);
            iVar2._M_current =
                 (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&property->list_data_,iVar2,(long *)&local_70);
            }
            else {
              *iVar2._M_current = (long)local_70;
              (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            local_70 = (double)(long)local_74;
            iVar2._M_current =
                 (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&property->list_data_,iVar2,(long *)&local_70);
            }
            else {
              *iVar2._M_current = (long)local_70;
              (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
          }
          if (0 < local_74) {
            iVar9 = 0;
            do {
              parser::SkipWhitespace(buffer);
              if (property->data_type_ - DT_FLOAT32 < 2) {
                bVar3 = parser::ParseFloat(buffer,&local_64);
                if (!bVar3) goto LAB_00120a87;
                local_70 = (double)local_64;
                if (local_60.convert_value_func_.super__Function_base._M_manager ==
                    (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
LAB_00120ad5:
                  uVar5 = std::__throw_bad_function_call();
                  __clang_call_terminate(uVar5);
                }
                (*local_60.convert_value_func_._M_invoker)
                          ((_Any_data *)&local_60.convert_value_func_,&local_70);
              }
              else {
                bVar3 = parser::ParseSignedInt(buffer,(int32_t *)&local_64);
                if (!bVar3) goto LAB_00120a87;
                local_70 = (double)(int)local_64;
                if (local_60.convert_value_func_.super__Function_base._M_manager ==
                    (_Manager_type)0x0) goto LAB_00120ad5;
                (*local_60.convert_value_func_._M_invoker)
                          ((_Any_data *)&local_60.convert_value_func_,&local_70);
              }
              if (bVar3 == false) {
LAB_00120a87:
                if (local_60.convert_value_func_.super__Function_base._M_manager ==
                    (_Manager_type)0x0) {
                  return bVar4;
                }
                (*local_60.convert_value_func_.super__Function_base._M_manager)
                          ((_Any_data *)&local_60.convert_value_func_,
                           (_Any_data *)&local_60.convert_value_func_,__destroy_functor);
                return bVar4;
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 < local_74);
          }
          if (local_60.convert_value_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_60.convert_value_func_.super__Function_base._M_manager)
                      ((_Any_data *)&local_60.convert_value_func_,
                       (_Any_data *)&local_60.convert_value_func_,__destroy_functor);
          }
          lVar8 = lVar8 + 1;
          lVar7 = *(long *)&pPVar1[element_index].properties_.
                            super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                            ._M_impl;
        } while (lVar8 < (int)((ulong)((long)*(pointer *)
                                              ((long)&pPVar1[element_index].properties_.
                                                                                                            
                                                  super__Vector_base<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>
                                              + 8) - lVar7) >> 5) * -0x55555555);
      }
      uVar6 = (int)local_38 + 1;
      local_38 = (ulong)uVar6;
      iVar9 = (int)pPVar1[element_index].num_entries_;
      bVar4 = iVar9 <= (int)uVar6;
    } while ((int)uVar6 < iVar9);
  }
  return bVar4;
}

Assistant:

bool PlyReader::ParseElementDataAscii(DecoderBuffer *buffer,
                                      int element_index) {
  PlyElement &element = elements_[element_index];
  for (int entry = 0; entry < element.num_entries(); ++entry) {
    for (int i = 0; i < element.num_properties(); ++i) {
      PlyProperty &prop = element.property(i);
      PlyPropertyWriter<double> prop_writer(&prop);
      int32_t num_entries = 1;
      if (prop.is_list()) {
        parser::SkipWhitespace(buffer);
        // Parse the number of entries for the list element.
        if (!parser::ParseSignedInt(buffer, &num_entries)) {
          return false;
        }

        // Store offset to the main data entry.
        prop.list_data_.push_back(prop.data_.size() /
                                  prop.data_type_num_bytes_);
        // Store the number of entries.
        prop.list_data_.push_back(num_entries);
      }
      // Read and store the actual property data.
      for (int v = 0; v < num_entries; ++v) {
        parser::SkipWhitespace(buffer);
        if (prop.data_type() == DT_FLOAT32 || prop.data_type() == DT_FLOAT64) {
          float val;
          if (!parser::ParseFloat(buffer, &val)) {
            return false;
          }
          prop_writer.PushBackValue(val);
        } else {
          int32_t val;
          if (!parser::ParseSignedInt(buffer, &val)) {
            return false;
          }
          prop_writer.PushBackValue(val);
        }
      }
    }
  }
  return true;
}